

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int js_parse_regexp(JSParseState *s)

{
  byte bVar1;
  uint8_t *puVar2;
  bool bVar3;
  int iVar4;
  uint32_t c;
  int iVar5;
  uint uVar6;
  char *fmt;
  byte *p;
  byte *p_00;
  byte *pbVar7;
  JSValue JVar8;
  uint8_t *p_next_1;
  uint8_t *p_next;
  StringBuffer local_70;
  StringBuffer local_50;
  
  puVar2 = s->buf_ptr;
  iVar4 = string_buffer_init(s->ctx,&local_50,0x20);
  if (iVar4 != 0) {
    return -1;
  }
  iVar4 = string_buffer_init(s->ctx,&local_70,1);
  if (iVar4 == 0) {
    bVar3 = false;
    p_00 = puVar2 + 1;
    do {
      if (s->buf_end <= p_00) {
LAB_0014aeb8:
        fmt = "unexpected end of regexp";
        goto LAB_0014af33;
      }
      p = p_00 + 1;
      bVar1 = *p_00;
      c = (uint32_t)bVar1;
      pbVar7 = p;
      if (bVar1 == 0x2f) {
        if (!bVar3) {
          goto LAB_0014aecb;
        }
        uVar6 = 0x2f;
LAB_0014ae8e:
        c = uVar6;
        bVar3 = true;
      }
      else {
        uVar6 = (uint)bVar1;
        if (bVar1 == 0x5b) goto LAB_0014ae8e;
        if (bVar1 == 0x5c) {
          iVar4 = string_buffer_putc8(&local_50,0x5c);
          if (iVar4 != 0) break;
          bVar1 = p_00[1];
          pbVar7 = p_00 + 2;
          c = (uint32_t)bVar1;
          if (bVar1 == 0) {
            c = 0;
            if (s->buf_end <= pbVar7) goto LAB_0014aeb8;
          }
          else {
            if ((c == 10) || (c == 0xd)) {
LAB_0014af2c:
              fmt = "unexpected line terminator in regexp";
              goto LAB_0014af33;
            }
            if ((char)bVar1 < '\0') {
              c = unicode_from_utf8(p,6,&p_next_1);
              iVar4 = 0;
              if ((c & 0x1ffffe) == 0x2028) {
                iVar4 = 6;
              }
              iVar5 = 7;
              if (c < 0x110000) {
                pbVar7 = p_next_1;
                iVar5 = iVar4;
              }
              if (iVar5 != 0) {
                if (iVar5 == 6) goto LAB_0014af2c;
                if (iVar5 != 7) {
                  return -1;
                }
                goto LAB_0014af23;
              }
            }
          }
        }
        else if (bVar1 == 0x5d) {
          bVar3 = false;
          c = 0x5d;
        }
        else {
          if ((bVar1 == 10) || (bVar1 == 0xd)) goto LAB_0014af2c;
          if ((char)bVar1 < '\0') {
            c = unicode_from_utf8(p_00,6,&p_next);
            if (0x10ffff < c) goto LAB_0014af23;
            pbVar7 = p_next;
            if ((c & 0x1ffffe) == 0x2028) goto LAB_0014af2c;
          }
        }
      }
      iVar4 = string_buffer_putc(&local_50,c);
      p_00 = pbVar7;
    } while (iVar4 == 0);
  }
  goto LAB_0014af3d;
LAB_0014af23:
  fmt = "invalid UTF-8 sequence";
LAB_0014af33:
  js_parse_error(s,fmt);
  goto LAB_0014af3d;
  while( true ) {
    iVar4 = lre_js_is_ident_next(uVar6);
    if (iVar4 == 0) {
      (s->token).val = -0x7c;
      JVar8 = string_buffer_end(&local_50);
      (s->token).u.str.str = JVar8;
      JVar8 = string_buffer_end(&local_70);
      (s->token).u.regexp.flags = JVar8;
      s->buf_ptr = p;
      return 0;
    }
    iVar4 = string_buffer_putc(&local_70,uVar6);
    p = p_next_1;
    if (iVar4 != 0) break;
LAB_0014aecb:
    p_next_1 = p + 1;
    uVar6 = (uint)(char)*p;
    if (((char)*p < '\0') && (uVar6 = unicode_from_utf8(p,6,&p_next_1), 0x10ffff < uVar6))
    goto LAB_0014af23;
  }
LAB_0014af3d:
  (*((local_50.ctx)->rt->mf).js_free)(&(local_50.ctx)->rt->malloc_state,local_50.str);
  (*((local_70.ctx)->rt->mf).js_free)(&(local_70.ctx)->rt->malloc_state,local_70.str);
  return -1;
}

Assistant:

static __exception int js_parse_regexp(JSParseState *s)
{
    const uint8_t *p;
    BOOL in_class;
    StringBuffer b_s, *b = &b_s;
    StringBuffer b2_s, *b2 = &b2_s;
    uint32_t c;

    p = s->buf_ptr;
    p++;
    in_class = FALSE;
    if (string_buffer_init(s->ctx, b, 32))
        return -1;
    if (string_buffer_init(s->ctx, b2, 1))
        goto fail;
    for(;;) {
        if (p >= s->buf_end) {
        eof_error:
            js_parse_error(s, "unexpected end of regexp");
            goto fail;
        }
        c = *p++;
        if (c == '\n' || c == '\r') {
            goto eol_error;
        } else if (c == '/') {
            if (!in_class)
                break;
        } else if (c == '[') {
            in_class = TRUE;
        } else if (c == ']') {
            /* XXX: incorrect as the first character in a class */
            in_class = FALSE;
        } else if (c == '\\') {
            if (string_buffer_putc8(b, c))
                goto fail;
            c = *p++;
            if (c == '\n' || c == '\r')
                goto eol_error;
            else if (c == '\0' && p >= s->buf_end)
                goto eof_error;
            else if (c >= 0x80) {
                const uint8_t *p_next;
                c = unicode_from_utf8(p - 1, UTF8_CHAR_LEN_MAX, &p_next);
                if (c > 0x10FFFF) {
                    goto invalid_utf8;
                }
                p = p_next;
                if (c == CP_LS || c == CP_PS)
                    goto eol_error;
            }
        } else if (c >= 0x80) {
            const uint8_t *p_next;
            c = unicode_from_utf8(p - 1, UTF8_CHAR_LEN_MAX, &p_next);
            if (c > 0x10FFFF) {
            invalid_utf8:
                js_parse_error(s, "invalid UTF-8 sequence");
                goto fail;
            }
            p = p_next;
            /* LS or PS are considered as line terminator */
            if (c == CP_LS || c == CP_PS) {
            eol_error:
                js_parse_error(s, "unexpected line terminator in regexp");
                goto fail;
            }
        }
        if (string_buffer_putc(b, c))
            goto fail;
    }

    /* flags */
    for(;;) {
        const uint8_t *p_next = p;
        c = *p_next++;
        if (c >= 0x80) {
            c = unicode_from_utf8(p, UTF8_CHAR_LEN_MAX, &p_next);
            if (c > 0x10FFFF) {
                goto invalid_utf8;
            }
        }
        if (!lre_js_is_ident_next(c))
            break;
        if (string_buffer_putc(b2, c))
            goto fail;
        p = p_next;
    }

    s->token.val = TOK_REGEXP;
    s->token.u.regexp.body = string_buffer_end(b);
    s->token.u.regexp.flags = string_buffer_end(b2);
    s->buf_ptr = p;
    return 0;
 fail:
    string_buffer_free(b);
    string_buffer_free(b2);
    return -1;
}